

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  long lVar6;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  cpp_dec_float<50U,_int,_void> local_408;
  cpp_dec_float<50U,_int,_void> local_3c8;
  uint local_38c;
  cpp_dec_float<50U,_int,_void> local_388;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_350;
  cpp_dec_float<50U,_int,_void> local_348;
  ulong local_310;
  cpp_dec_float<50U,_int,_void> *local_308;
  cpp_dec_float<50U,_int,_void> *local_300;
  cpp_dec_float<50U,_int,_void> local_2f8;
  shared_ptr<soplex::Tolerances> local_2b8;
  shared_ptr<soplex::Tolerances> local_2a8;
  cpp_dec_float<50U,_int,_void> local_298;
  cpp_dec_float<50U,_int,_void> local_258;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_218;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  uint local_198 [2];
  uint auStack_190 [2];
  uint local_188 [2];
  undefined8 uStack_180;
  undefined8 local_178;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_f0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar4 = (this->matrix).thesize;
  uVar9 = (ulong)iVar4;
  local_2f8.fpclass = cpp_dec_float_finite;
  local_2f8.prec_elem = 10;
  local_2f8.data._M_elems[0] = 0;
  local_2f8.data._M_elems[1] = 0;
  local_2f8.data._M_elems[2] = 0;
  local_2f8.data._M_elems[3] = 0;
  local_2f8.data._M_elems[4] = 0;
  local_2f8.data._M_elems[5] = 0;
  local_2f8.data._M_elems._24_5_ = 0;
  local_2f8.data._M_elems[7]._1_3_ = 0;
  local_2f8.data._M_elems._32_5_ = 0;
  local_2f8.data._M_elems[9]._1_3_ = 0;
  local_2f8.exp = 0;
  local_2f8.neg = false;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  local_408.fpclass = cpp_dec_float_finite;
  local_408.prec_elem = 10;
  local_408.data._M_elems[0] = 0;
  local_408.data._M_elems[1] = 0;
  local_408.data._M_elems[2] = 0;
  local_408.data._M_elems[3] = 0;
  local_408.data._M_elems[4] = 0;
  local_408.data._M_elems[5] = 0;
  local_408.data._M_elems[6] = 0;
  local_408.data._M_elems[7] = 0;
  local_408.data._M_elems._32_5_ = 0;
  local_408.data._M_elems[9]._1_3_ = 0;
  local_408.exp = 0;
  local_408.neg = false;
  local_348.fpclass = cpp_dec_float_finite;
  local_348.prec_elem = 10;
  local_348.data._M_elems[0] = 0;
  local_348.data._M_elems[1] = 0;
  local_348.data._M_elems[2] = 0;
  local_348.data._M_elems[3] = 0;
  local_348.data._M_elems[4] = 0;
  local_348.data._M_elems[5] = 0;
  local_348.data._M_elems[6] = 0;
  local_348.data._M_elems[7] = 0;
  local_348.data._M_elems._32_5_ = 0;
  local_348.data._M_elems[9]._1_3_ = 0;
  local_348.exp = 0;
  local_348.neg = false;
  local_38c = maxiters;
  if ((long)uVar9 < 1) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_218,iVar4,&local_2a8);
    if (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_b8,iVar4,&local_2b8);
    if (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    }
    else {
      local_310 = uVar9;
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      uVar9 = local_310;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f0,local_310,(type *)0x0);
      local_3c8.fpclass = cpp_dec_float_finite;
      local_3c8.prec_elem = 10;
      local_3c8.data._M_elems._0_16_ = ZEXT816(0);
      local_3c8.data._M_elems[4] = 0;
      local_3c8.data._M_elems[5] = 0;
      local_3c8.data._M_elems._24_5_ = 0;
      local_3c8.data._M_elems[7]._1_3_ = 0;
      local_3c8.data._M_elems._32_5_ = 0;
      local_3c8.data._M_elems[9]._1_3_ = 0;
      local_3c8.exp = 0;
      local_3c8.neg = false;
      local_388.fpclass = cpp_dec_float_finite;
      local_388.prec_elem = 10;
      local_388.data._M_elems._0_16_ = ZEXT816(0);
      local_388.data._M_elems[4] = 0;
      local_388.data._M_elems[5] = 0;
      local_388.data._M_elems._24_5_ = 0;
      local_388.data._M_elems[7]._1_3_ = 0;
      local_388.data._M_elems._32_5_ = 0;
      local_388.data._M_elems[9]._1_3_ = 0;
      local_388.exp = 0;
      local_388.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_3c8,&local_388,&local_f0);
      auVar3 = (undefined1  [16])local_3c8.data._M_elems._0_16_;
      local_408.data._M_elems[0] = local_3c8.data._M_elems[0];
      local_408.data._M_elems[1] = local_3c8.data._M_elems[1];
      local_408.data._M_elems[2] = local_3c8.data._M_elems[2];
      local_408.data._M_elems[3] = local_3c8.data._M_elems[3];
      local_408.data._M_elems[4] = local_3c8.data._M_elems[4];
      local_408.data._M_elems[5] = local_3c8.data._M_elems[5];
      local_408.data._M_elems[6] = local_3c8.data._M_elems[6];
      local_408.data._M_elems[7] =
           (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >> 0x20)
      ;
      local_408.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
      local_408.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
      local_408.exp = local_3c8.exp;
      local_408.neg = local_3c8.neg;
      local_408.fpclass = local_3c8.fpclass;
      local_408.prec_elem = local_3c8.prec_elem;
      uVar5 = 1;
      if (1 < (int)uVar9) {
        uVar5 = uVar9 & 0xffffffff;
      }
      lVar6 = 0x30;
      uVar9 = 0;
      do {
        local_178 = CONCAT35(local_3c8.data._M_elems[9]._1_3_,local_3c8.data._M_elems._32_5_);
        uStack_180 = CONCAT44(local_408.data._M_elems[7],local_408.data._M_elems[6]);
        local_188[0] = local_3c8.data._M_elems[4];
        local_188[1] = local_3c8.data._M_elems[5];
        local_198[0] = local_3c8.data._M_elems[0];
        local_198[1] = local_3c8.data._M_elems[1];
        auStack_190[0] = local_3c8.data._M_elems[2];
        auStack_190[1] = local_3c8.data._M_elems[3];
        lVar8 = (long)local_218.super_IdxSet.num;
        local_218.super_IdxSet.num = local_218.super_IdxSet.num + 1;
        local_218.super_IdxSet.idx[lVar8] = (int)uVar9;
        *(undefined8 *)
         ((long)((local_218.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
         lVar6 + -0x10) = local_178;
        puVar1 = (uint *)((long)((local_218.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar6 + -0x20);
        *(undefined8 *)puVar1 = local_3c8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = uStack_180;
        puVar1 = (uint *)((long)((local_218.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar6 + -0x30);
        *(undefined8 *)puVar1 = local_3c8.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_3c8.data._M_elems._8_8_;
        *(int *)((long)((local_218.
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar6 + -8) = local_3c8.exp;
        *(bool *)((long)((local_218.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar6 + -4) = local_3c8.neg;
        *(undefined8 *)
         ((long)((local_218.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar6) =
             local_3c8._48_8_;
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 0x38;
      } while (uVar5 != uVar9);
      local_3c8.data._M_elems._0_16_ = auVar3;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_b8,&local_218);
      local_350 = this;
      local_308 = &tolerance->m_backend;
      local_300 = &__return_storage_ptr__->m_backend;
      if (0 < (int)local_38c) {
        uVar10 = 0;
        do {
          __return_storage_ptr__ =
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_300;
          local_348.data._M_elems._32_5_ = local_408.data._M_elems._32_5_;
          local_348.data._M_elems[9]._1_3_ = local_408.data._M_elems[9]._1_3_;
          local_348.data._M_elems[4] = local_408.data._M_elems[4];
          local_348.data._M_elems[5] = local_408.data._M_elems[5];
          local_348.data._M_elems[6] = local_408.data._M_elems[6];
          local_348.data._M_elems[7] = local_408.data._M_elems[7];
          local_348.data._M_elems[0] = local_408.data._M_elems[0];
          local_348.data._M_elems[1] = local_408.data._M_elems[1];
          local_348.data._M_elems[2] = local_408.data._M_elems[2];
          local_348.data._M_elems[3] = local_408.data._M_elems[3];
          local_348.exp = local_408.exp;
          local_348.neg = local_408.neg;
          local_348.fpclass = local_408.fpclass;
          local_348.prec_elem = local_408.prec_elem;
          multBaseWith(local_350,&local_218,&local_b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,&local_b8);
          auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
          local_408.data._M_elems._32_5_ = local_388.data._M_elems._32_5_;
          local_408.data._M_elems[9]._1_3_ = local_388.data._M_elems[9]._1_3_;
          local_408.data._M_elems[4] = local_388.data._M_elems[4];
          local_408.data._M_elems[5] = local_388.data._M_elems[5];
          local_408.data._M_elems[6] = local_388.data._M_elems[6];
          local_408.data._M_elems[7] =
               (uint)(CONCAT35(local_388.data._M_elems[7]._1_3_,local_388.data._M_elems._24_5_) >>
                     0x20);
          local_408.data._M_elems[0] = local_388.data._M_elems[0];
          local_408.data._M_elems[1] = local_388.data._M_elems[1];
          local_408.data._M_elems[2] = local_388.data._M_elems[2];
          local_408.data._M_elems[3] = local_388.data._M_elems[3];
          local_408.exp = local_388.exp;
          local_408.neg = local_388.neg;
          local_408.fpclass = local_388.fpclass;
          local_408.prec_elem = local_388.prec_elem;
          if (2 < uVar10) {
            local_258.data._M_elems[9]._1_3_ = local_388.data._M_elems[9]._1_3_;
            local_258.data._M_elems._32_5_ = local_388.data._M_elems._32_5_;
            local_258.data._M_elems[7] = local_408.data._M_elems[7];
            local_258.data._M_elems[6] = local_408.data._M_elems[6];
            local_258.data._M_elems[4] = local_388.data._M_elems[4];
            local_258.data._M_elems[5] = local_388.data._M_elems[5];
            local_258.data._M_elems[0] = local_388.data._M_elems[0];
            local_258.data._M_elems[1] = local_388.data._M_elems[1];
            local_258.data._M_elems[2] = local_388.data._M_elems[2];
            local_258.data._M_elems[3] = local_388.data._M_elems[3];
            local_258.exp = local_388.exp;
            local_258.neg = local_388.neg;
            local_258.fpclass = local_388.fpclass;
            local_258.prec_elem = local_388.prec_elem;
            local_388.data._M_elems._0_16_ = auVar3;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_258,&local_348);
            local_388.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
            local_388.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
            local_388.data._M_elems[4] = local_258.data._M_elems[4];
            local_388.data._M_elems[5] = local_258.data._M_elems[5];
            local_388.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
            local_388.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
            local_388.data._M_elems[2] = local_258.data._M_elems[2];
            local_388.data._M_elems[3] = local_258.data._M_elems[3];
            local_388.data._M_elems[0] = local_258.data._M_elems[0];
            local_388.data._M_elems[1] = local_258.data._M_elems[1];
            auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
            local_388.exp = local_258.exp;
            local_388.neg = local_258.neg;
            local_388.fpclass = local_258.fpclass;
            local_388.prec_elem = local_258.prec_elem;
            if ((local_258.neg == true) &&
               (local_388.data._M_elems[0] = local_258.data._M_elems[0],
               local_258.fpclass != cpp_dec_float_finite || local_388.data._M_elems[0] != 0)) {
              local_388.neg = false;
            }
            local_3c8.fpclass = cpp_dec_float_finite;
            local_3c8.prec_elem = 10;
            local_3c8.data._M_elems[0] = 0;
            local_3c8.data._M_elems[1] = 0;
            local_3c8.data._M_elems[2] = 0;
            local_3c8.data._M_elems[3] = 0;
            local_3c8.data._M_elems[4] = 0;
            local_3c8.data._M_elems[5] = 0;
            local_3c8.data._M_elems._24_5_ = 0;
            local_3c8.data._M_elems[7]._1_3_ = 0;
            local_3c8.data._M_elems._32_5_ = 0;
            local_3c8.data._M_elems[9]._1_3_ = 0;
            local_3c8.exp = 0;
            local_3c8.neg = false;
            if (&local_3c8 != local_308) {
              uVar2 = *(undefined8 *)((local_308->data)._M_elems + 8);
              local_3c8.data._M_elems._32_5_ = SUB85(uVar2,0);
              local_3c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
              local_3c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(local_308->data)._M_elems;
              local_3c8.data._M_elems._16_8_ = *(undefined8 *)((local_308->data)._M_elems + 4);
              uVar2 = *(undefined8 *)((local_308->data)._M_elems + 6);
              local_3c8.data._M_elems._24_5_ = SUB85(uVar2,0);
              local_3c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
              local_3c8.exp = local_308->exp;
              local_3c8.neg = local_308->neg;
              local_3c8.fpclass = local_308->fpclass;
              local_3c8.prec_elem = local_308->prec_elem;
            }
            local_388.data._M_elems._0_16_ = auVar3;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_3c8,&local_408);
            auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
            if ((local_388.fpclass != cpp_dec_float_NaN) && (local_3c8.fpclass != cpp_dec_float_NaN)
               ) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_388,&local_3c8);
              auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
              if (iVar4 < 0) break;
            }
          }
          local_388.data._M_elems._0_16_ = auVar3;
          multWithBase(local_350,&local_b8,&local_218);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f0,&local_218);
          local_3c8.fpclass = cpp_dec_float_finite;
          local_3c8.prec_elem = 10;
          local_3c8.data._M_elems[0] = 0;
          local_3c8.data._M_elems[1] = 0;
          local_3c8.data._M_elems[2] = 0;
          local_3c8.data._M_elems[3] = 0;
          local_3c8.data._M_elems[4] = 0;
          local_3c8.data._M_elems[5] = 0;
          local_3c8.data._M_elems._24_5_ = 0;
          local_3c8.data._M_elems[7]._1_3_ = 0;
          local_3c8.data._M_elems._32_5_ = 0;
          local_3c8.data._M_elems[9]._1_3_ = 0;
          local_3c8.exp = 0;
          local_3c8.neg = false;
          local_388.fpclass = cpp_dec_float_finite;
          local_388.prec_elem = 10;
          local_388.data._M_elems[0] = 0;
          local_388.data._M_elems[1] = 0;
          local_388.data._M_elems[2] = 0;
          local_388.data._M_elems[3] = 0;
          local_388.data._M_elems[4] = 0;
          local_388.data._M_elems[5] = 0;
          local_388.data._M_elems._24_5_ = 0;
          local_388.data._M_elems[7]._1_3_ = 0;
          local_388.data._M_elems._32_5_ = 0;
          local_388.data._M_elems[9]._1_3_ = 0;
          local_388.exp = 0;
          local_388.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_3c8,&local_388,&local_f0);
          auVar3 = (undefined1  [16])local_3c8.data._M_elems._0_16_;
          local_128.data._M_elems[7]._1_3_ = local_3c8.data._M_elems[7]._1_3_;
          local_128.data._M_elems._24_5_ = local_3c8.data._M_elems._24_5_;
          local_348.data._M_elems[0] = local_3c8.data._M_elems[0];
          local_348.data._M_elems[1] = local_3c8.data._M_elems[1];
          local_348.data._M_elems[2] = local_3c8.data._M_elems[2];
          local_348.data._M_elems[3] = local_3c8.data._M_elems[3];
          local_348.data._M_elems[4] = local_3c8.data._M_elems[4];
          local_348.data._M_elems[5] = local_3c8.data._M_elems[5];
          local_348.data._M_elems[6] = local_3c8.data._M_elems[6];
          local_348.data._M_elems[7] = local_128.data._M_elems[7];
          local_128.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
          local_128.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
          local_348.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
          local_348.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
          local_348.exp = local_3c8.exp;
          local_348.neg = local_3c8.neg;
          local_128.fpclass = local_3c8.fpclass;
          local_128.prec_elem = local_3c8.prec_elem;
          local_348.fpclass = local_3c8.fpclass;
          local_348.prec_elem = local_3c8.prec_elem;
          local_128.data._M_elems[0] = local_3c8.data._M_elems[0];
          local_128.data._M_elems[1] = local_3c8.data._M_elems[1];
          local_128.data._M_elems[2] = local_3c8.data._M_elems[2];
          local_128.data._M_elems[3] = local_3c8.data._M_elems[3];
          local_128.data._M_elems[4] = local_3c8.data._M_elems[4];
          local_128.data._M_elems[5] = local_3c8.data._M_elems[5];
          local_128.exp = local_3c8.exp;
          local_128.neg = local_3c8.neg;
          local_3c8.data._M_elems._0_16_ = auVar3;
          if (0 < (long)local_218.super_IdxSet.num) {
            lVar6 = (long)local_218.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_218.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_218.super_IdxSet.idx[lVar6 + -2]].m_backend,&local_128);
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          uVar10 = uVar10 + 1;
          __return_storage_ptr__ =
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_300;
        } while (uVar10 != local_38c);
      }
      local_2f8.data._M_elems._32_5_ = local_408.data._M_elems._32_5_;
      local_2f8.data._M_elems[9]._1_3_ = local_408.data._M_elems[9]._1_3_;
      local_2f8.data._M_elems[4] = local_408.data._M_elems[4];
      local_2f8.data._M_elems[5] = local_408.data._M_elems[5];
      local_2f8.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_408.data._M_elems[7],local_408.data._M_elems[6]),0);
      local_2f8.data._M_elems[7]._1_3_ = (undefined3)(local_408.data._M_elems[7] >> 8);
      local_2f8.data._M_elems[0] = local_408.data._M_elems[0];
      local_2f8.data._M_elems[1] = local_408.data._M_elems[1];
      local_2f8.data._M_elems[2] = local_408.data._M_elems[2];
      local_2f8.data._M_elems[3] = local_408.data._M_elems[3];
      local_2f8.exp = local_408.exp;
      local_2f8.neg = local_408.neg;
      local_2f8.fpclass = local_408.fpclass;
      local_2f8.prec_elem = local_408.prec_elem;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_218);
      pSVar7 = local_350;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_b8);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f0,local_310,(type *)0x0);
      local_3c8.fpclass = cpp_dec_float_finite;
      local_3c8.prec_elem = 10;
      local_3c8.data._M_elems._0_16_ = ZEXT816(0);
      local_3c8.data._M_elems[4] = 0;
      local_3c8.data._M_elems[5] = 0;
      local_3c8.data._M_elems._24_5_ = 0;
      local_3c8.data._M_elems[7]._1_3_ = 0;
      local_3c8.data._M_elems._32_5_ = 0;
      local_3c8.data._M_elems[9]._1_3_ = 0;
      local_3c8.exp = 0;
      local_3c8.neg = false;
      local_388.fpclass = cpp_dec_float_finite;
      local_388.prec_elem = 10;
      local_388.data._M_elems._0_16_ = ZEXT816(0);
      local_388.data._M_elems[4] = 0;
      local_388.data._M_elems[5] = 0;
      local_388.data._M_elems._24_5_ = 0;
      local_388.data._M_elems[7]._1_3_ = 0;
      local_388.data._M_elems._32_5_ = 0;
      local_388.data._M_elems[9]._1_3_ = 0;
      local_388.exp = 0;
      local_388.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_3c8,&local_388,&local_f0);
      auVar3 = (undefined1  [16])local_3c8.data._M_elems._0_16_;
      local_408.data._M_elems[0] = local_3c8.data._M_elems[0];
      local_408.data._M_elems[1] = local_3c8.data._M_elems[1];
      local_408.data._M_elems[2] = local_3c8.data._M_elems[2];
      local_408.data._M_elems[3] = local_3c8.data._M_elems[3];
      local_408.data._M_elems[4] = local_3c8.data._M_elems[4];
      local_408.data._M_elems[5] = local_3c8.data._M_elems[5];
      local_408.data._M_elems[6] = local_3c8.data._M_elems[6];
      local_408.data._M_elems[7] =
           (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >> 0x20)
      ;
      local_408.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
      local_408.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
      local_408.exp = local_3c8.exp;
      local_408.neg = local_3c8.neg;
      local_408.fpclass = local_3c8.fpclass;
      local_408.prec_elem = local_3c8.prec_elem;
      uVar9 = 1;
      if (1 < (int)local_310) {
        uVar9 = local_310 & 0xffffffff;
      }
      lVar6 = 0x30;
      uVar5 = 0;
      do {
        local_1a8 = CONCAT35(local_3c8.data._M_elems[9]._1_3_,local_3c8.data._M_elems._32_5_);
        uStack_1b0 = CONCAT44(local_408.data._M_elems[7],local_408.data._M_elems[6]);
        local_1b8[0] = local_3c8.data._M_elems[4];
        local_1b8[1] = local_3c8.data._M_elems[5];
        local_1c8[0] = local_3c8.data._M_elems[0];
        local_1c8[1] = local_3c8.data._M_elems[1];
        auStack_1c0[0] = local_3c8.data._M_elems[2];
        auStack_1c0[1] = local_3c8.data._M_elems[3];
        lVar8 = (long)local_218.super_IdxSet.num;
        local_218.super_IdxSet.num = local_218.super_IdxSet.num + 1;
        local_218.super_IdxSet.idx[lVar8] = (int)uVar5;
        *(undefined8 *)
         ((long)((local_218.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
         lVar6 + -0x10) = local_1a8;
        puVar1 = (uint *)((long)((local_218.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar6 + -0x20);
        *(undefined8 *)puVar1 = local_3c8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = uStack_1b0;
        puVar1 = (uint *)((long)((local_218.
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar6 + -0x30);
        *(undefined8 *)puVar1 = local_3c8.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_3c8.data._M_elems._8_8_;
        *(int *)((long)((local_218.
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar6 + -8) = local_3c8.exp;
        *(bool *)((long)((local_218.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar6 + -4) = local_3c8.neg;
        *(undefined8 *)
         ((long)((local_218.
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar6) =
             local_3c8._48_8_;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x38;
      } while (uVar9 != uVar5);
      local_3c8.data._M_elems._0_16_ = auVar3;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_b8,&local_218);
      if (0 < (int)local_38c) {
        uVar10 = 0;
        do {
          local_348.data._M_elems._32_5_ = local_408.data._M_elems._32_5_;
          local_348.data._M_elems[9]._1_3_ = local_408.data._M_elems[9]._1_3_;
          local_348.data._M_elems[4] = local_408.data._M_elems[4];
          local_348.data._M_elems[5] = local_408.data._M_elems[5];
          local_348.data._M_elems[6] = local_408.data._M_elems[6];
          local_348.data._M_elems[7] = local_408.data._M_elems[7];
          local_348.data._M_elems[0] = local_408.data._M_elems[0];
          local_348.data._M_elems[1] = local_408.data._M_elems[1];
          local_348.data._M_elems[2] = local_408.data._M_elems[2];
          local_348.data._M_elems[3] = local_408.data._M_elems[3];
          local_348.exp = local_408.exp;
          local_348.neg = local_408.neg;
          local_348.fpclass = local_408.fpclass;
          local_348.prec_elem = local_408.prec_elem;
          (*pSVar7->factor->_vptr_SLinSolver[0xd])(pSVar7->factor,&local_218,&local_b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_218);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,&local_218);
          auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
          local_408.data._M_elems._32_5_ = local_388.data._M_elems._32_5_;
          local_408.data._M_elems[9]._1_3_ = local_388.data._M_elems[9]._1_3_;
          local_408.data._M_elems[4] = local_388.data._M_elems[4];
          local_408.data._M_elems[5] = local_388.data._M_elems[5];
          local_408.data._M_elems[6] = local_388.data._M_elems[6];
          local_408.data._M_elems[7] =
               (uint)(CONCAT35(local_388.data._M_elems[7]._1_3_,local_388.data._M_elems._24_5_) >>
                     0x20);
          local_408.data._M_elems[0] = local_388.data._M_elems[0];
          local_408.data._M_elems[1] = local_388.data._M_elems[1];
          local_408.data._M_elems[2] = local_388.data._M_elems[2];
          local_408.data._M_elems[3] = local_388.data._M_elems[3];
          local_408.exp = local_388.exp;
          local_408.neg = local_388.neg;
          local_408.fpclass = local_388.fpclass;
          local_408.prec_elem = local_388.prec_elem;
          if (2 < uVar10) {
            local_298.data._M_elems[9]._1_3_ = local_388.data._M_elems[9]._1_3_;
            local_298.data._M_elems._32_5_ = local_388.data._M_elems._32_5_;
            local_298.data._M_elems[7] = local_408.data._M_elems[7];
            local_298.data._M_elems[6] = local_408.data._M_elems[6];
            local_298.data._M_elems[4] = local_388.data._M_elems[4];
            local_298.data._M_elems[5] = local_388.data._M_elems[5];
            local_298.data._M_elems[0] = local_388.data._M_elems[0];
            local_298.data._M_elems[1] = local_388.data._M_elems[1];
            local_298.data._M_elems[2] = local_388.data._M_elems[2];
            local_298.data._M_elems[3] = local_388.data._M_elems[3];
            local_298.exp = local_388.exp;
            local_298.neg = local_388.neg;
            local_298.fpclass = local_388.fpclass;
            local_298.prec_elem = local_388.prec_elem;
            local_388.data._M_elems._0_16_ = auVar3;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_298,&local_348);
            pSVar7 = local_350;
            local_388.data._M_elems._32_5_ = local_298.data._M_elems._32_5_;
            local_388.data._M_elems[9]._1_3_ = local_298.data._M_elems[9]._1_3_;
            local_388.data._M_elems[4] = local_298.data._M_elems[4];
            local_388.data._M_elems[5] = local_298.data._M_elems[5];
            local_388.data._M_elems._24_5_ = local_298.data._M_elems._24_5_;
            local_388.data._M_elems[7]._1_3_ = local_298.data._M_elems[7]._1_3_;
            local_388.data._M_elems[2] = local_298.data._M_elems[2];
            local_388.data._M_elems[3] = local_298.data._M_elems[3];
            local_388.data._M_elems[0] = local_298.data._M_elems[0];
            local_388.data._M_elems[1] = local_298.data._M_elems[1];
            auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
            local_388.exp = local_298.exp;
            local_388.neg = local_298.neg;
            local_388.fpclass = local_298.fpclass;
            local_388.prec_elem = local_298.prec_elem;
            if ((local_298.neg == true) &&
               (local_388.data._M_elems[0] = local_298.data._M_elems[0],
               local_298.fpclass != cpp_dec_float_finite || local_388.data._M_elems[0] != 0)) {
              local_388.neg = false;
            }
            local_3c8.fpclass = cpp_dec_float_finite;
            local_3c8.prec_elem = 10;
            local_3c8.data._M_elems[0] = 0;
            local_3c8.data._M_elems[1] = 0;
            local_3c8.data._M_elems[2] = 0;
            local_3c8.data._M_elems[3] = 0;
            local_3c8.data._M_elems[4] = 0;
            local_3c8.data._M_elems[5] = 0;
            local_3c8.data._M_elems._24_5_ = 0;
            local_3c8.data._M_elems[7]._1_3_ = 0;
            local_3c8.data._M_elems._32_5_ = 0;
            local_3c8.data._M_elems[9]._1_3_ = 0;
            local_3c8.exp = 0;
            local_3c8.neg = false;
            if (&local_3c8 != local_308) {
              uVar2 = *(undefined8 *)((local_308->data)._M_elems + 8);
              local_3c8.data._M_elems._32_5_ = SUB85(uVar2,0);
              local_3c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
              local_3c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(local_308->data)._M_elems;
              local_3c8.data._M_elems._16_8_ = *(undefined8 *)((local_308->data)._M_elems + 4);
              uVar2 = *(undefined8 *)((local_308->data)._M_elems + 6);
              local_3c8.data._M_elems._24_5_ = SUB85(uVar2,0);
              local_3c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
              local_3c8.exp = local_308->exp;
              local_3c8.neg = local_308->neg;
              local_3c8.fpclass = local_308->fpclass;
              local_3c8.prec_elem = local_308->prec_elem;
            }
            local_388.data._M_elems._0_16_ = auVar3;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_3c8,&local_408);
            auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
            if ((local_388.fpclass != cpp_dec_float_NaN) && (local_3c8.fpclass != cpp_dec_float_NaN)
               ) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_388,&local_3c8);
              auVar3 = (undefined1  [16])local_388.data._M_elems._0_16_;
              if (iVar4 < 0) break;
            }
          }
          local_388.data._M_elems._0_16_ = auVar3;
          (*pSVar7->factor->_vptr_SLinSolver[0x15])(pSVar7->factor,&local_b8,&local_218);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f0,&local_b8);
          local_3c8.fpclass = cpp_dec_float_finite;
          local_3c8.prec_elem = 10;
          local_3c8.data._M_elems[0] = 0;
          local_3c8.data._M_elems[1] = 0;
          local_3c8.data._M_elems[2] = 0;
          local_3c8.data._M_elems[3] = 0;
          local_3c8.data._M_elems[4] = 0;
          local_3c8.data._M_elems[5] = 0;
          local_3c8.data._M_elems._24_5_ = 0;
          local_3c8.data._M_elems[7]._1_3_ = 0;
          local_3c8.data._M_elems._32_5_ = 0;
          local_3c8.data._M_elems[9]._1_3_ = 0;
          local_3c8.exp = 0;
          local_3c8.neg = false;
          local_388.fpclass = cpp_dec_float_finite;
          local_388.prec_elem = 10;
          local_388.data._M_elems[0] = 0;
          local_388.data._M_elems[1] = 0;
          local_388.data._M_elems[2] = 0;
          local_388.data._M_elems[3] = 0;
          local_388.data._M_elems[4] = 0;
          local_388.data._M_elems[5] = 0;
          local_388.data._M_elems._24_5_ = 0;
          local_388.data._M_elems[7]._1_3_ = 0;
          local_388.data._M_elems._32_5_ = 0;
          local_388.data._M_elems[9]._1_3_ = 0;
          local_388.exp = 0;
          local_388.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_3c8,&local_388,&local_f0);
          auVar3 = (undefined1  [16])local_3c8.data._M_elems._0_16_;
          local_168.data._M_elems[7]._1_3_ = local_3c8.data._M_elems[7]._1_3_;
          local_168.data._M_elems._24_5_ = local_3c8.data._M_elems._24_5_;
          local_348.data._M_elems[0] = local_3c8.data._M_elems[0];
          local_348.data._M_elems[1] = local_3c8.data._M_elems[1];
          local_348.data._M_elems[2] = local_3c8.data._M_elems[2];
          local_348.data._M_elems[3] = local_3c8.data._M_elems[3];
          local_348.data._M_elems[4] = local_3c8.data._M_elems[4];
          local_348.data._M_elems[5] = local_3c8.data._M_elems[5];
          local_348.data._M_elems[6] = local_3c8.data._M_elems[6];
          local_348.data._M_elems[7] = local_168.data._M_elems[7];
          local_168.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
          local_168.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
          local_348.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
          local_348.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
          local_348.exp = local_3c8.exp;
          local_348.neg = local_3c8.neg;
          local_168.fpclass = local_3c8.fpclass;
          local_168.prec_elem = local_3c8.prec_elem;
          local_348.fpclass = local_3c8.fpclass;
          local_348.prec_elem = local_3c8.prec_elem;
          local_168.data._M_elems[0] = local_3c8.data._M_elems[0];
          local_168.data._M_elems[1] = local_3c8.data._M_elems[1];
          local_168.data._M_elems[2] = local_3c8.data._M_elems[2];
          local_168.data._M_elems[3] = local_3c8.data._M_elems[3];
          local_168.data._M_elems[4] = local_3c8.data._M_elems[4];
          local_168.data._M_elems[5] = local_3c8.data._M_elems[5];
          local_168.exp = local_3c8.exp;
          local_168.neg = local_3c8.neg;
          local_3c8.data._M_elems._0_16_ = auVar3;
          if (0 < (long)local_b8.super_IdxSet.num) {
            lVar6 = (long)local_b8.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_b8.super_IdxSet.idx[lVar6 + -2]].m_backend,&local_168);
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          uVar10 = uVar10 + 1;
          __return_storage_ptr__ =
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_300;
        } while (uVar10 != local_38c);
      }
      v = &local_68;
      local_68.data._M_elems._32_5_ = local_408.data._M_elems._32_5_;
      local_68.data._M_elems[9]._1_3_ = local_408.data._M_elems[9]._1_3_;
      local_68.data._M_elems[4] = local_408.data._M_elems[4];
      local_68.data._M_elems[5] = local_408.data._M_elems[5];
      local_68.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_408.data._M_elems[7],local_408.data._M_elems[6]),0);
      local_68.data._M_elems[7]._1_3_ = (undefined3)(local_408.data._M_elems[7] >> 8);
      local_68.data._M_elems[0] = local_408.data._M_elems[0];
      local_68.data._M_elems[1] = local_408.data._M_elems[1];
      local_68.data._M_elems[2] = local_408.data._M_elems[2];
      local_68.data._M_elems[3] = local_408.data._M_elems[3];
      local_68.exp = local_408.exp;
      local_68.neg = local_408.neg;
      local_68.fpclass = local_408.fpclass;
      local_68.prec_elem = local_408.prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
      (__return_storage_ptr__->m_backend).prec_elem = 10;
      (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
      *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
      if (v == &__return_storage_ptr__->m_backend) {
        v = &local_2f8;
      }
      else if (&local_2f8 != &__return_storage_ptr__->m_backend) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_2f8.data._M_elems[9]._1_3_,local_2f8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_2f8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_2f8.data._M_elems[7]._1_3_,local_2f8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_2f8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_2f8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_2f8.exp;
        (__return_storage_ptr__->m_backend).neg = local_2f8.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_2f8.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_2f8.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&__return_storage_ptr__->m_backend,v);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_b8);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_218);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&__return_storage_ptr__->m_backend;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}